

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPInform.cpp
# Opt level: O0

snmp_request_id_t
queue_and_send_trap(list<InformItem_*,_std::allocator<InformItem_*>_> *informList,SNMPTrap *trap,
                   IPAddress *ip,bool replaceQueuedRequests,int retries,int delay_ms)

{
  SNMPTrap *list;
  value_type local_78;
  InformItem *item;
  anon_class_8_1_8992202b local_60;
  function<bool_(InformItem_*)> local_58;
  undefined1 local_35;
  int local_34;
  int iStack_30;
  bool buildStatus;
  int delay_ms_local;
  int retries_local;
  bool replaceQueuedRequests_local;
  IPAddress *ip_local;
  SNMPTrap *trap_local;
  list<InformItem_*,_std::allocator<InformItem_*>_> *informList_local;
  
  local_34 = delay_ms;
  iStack_30 = retries;
  delay_ms_local._3_1_ = replaceQueuedRequests;
  _retries_local = ip;
  ip_local = (IPAddress *)trap;
  trap_local = (SNMPTrap *)informList;
  local_35 = SNMPTrap::buildForSending(trap);
  list = trap_local;
  if ((bool)local_35) {
    if ((delay_ms_local._3_1_ & 1) != 0) {
      local_60.trap = (SNMPTrap *)ip_local;
      std::function<bool(InformItem*)>::
      function<queue_and_send_trap(std::__cxx11::list<InformItem*,std::allocator<InformItem*>>&,SNMPTrap*,IPAddress_const&,bool,int,int)::__0,void>
                ((function<bool(InformItem*)> *)&local_58,&local_60);
      remove_inform_from_list((list<InformItem_*,_std::allocator<InformItem_*>_> *)list,&local_58);
      std::function<bool_(InformItem_*)>::~function(&local_58);
    }
    if ((ip_local[0xf].field_0xe & 1) == 0) {
      SNMPTrap::sendTo((SNMPTrap *)ip_local,_retries_local,false);
    }
    else {
      local_78 = (value_type)calloc(1,0x48);
      local_78->delay_ms = (long)local_34;
      local_78->received = false;
      local_78->requestID = (snmp_request_id_t)ip_local[4]._vptr_IPAddress;
      local_78->retries = iStack_30;
      IPAddress::operator=(&local_78->ip,_retries_local);
      local_78->lastSent = 0;
      local_78->trap = (SNMPTrap *)ip_local;
      local_78->missed = false;
      std::__cxx11::list<InformItem_*,_std::allocator<InformItem_*>_>::push_back
                ((list<InformItem_*,_std::allocator<InformItem_*>_> *)trap_local,&local_78);
      SNMPTrap::sendTo((SNMPTrap *)ip_local,_retries_local,true);
    }
    informList_local =
         (list<InformItem_*,_std::allocator<InformItem_*>_> *)ip_local[4]._vptr_IPAddress;
  }
  else {
    informList_local = (list<InformItem_*,_std::allocator<InformItem_*>_> *)0x0;
  }
  return (snmp_request_id_t)informList_local;
}

Assistant:

snmp_request_id_t
queue_and_send_trap(std::list<struct InformItem *> &informList, SNMPTrap *trap, const IPAddress& ip, bool replaceQueuedRequests,
                    int retries, int delay_ms) {
    bool buildStatus = trap->buildForSending();
    if(!buildStatus) {
        SNMP_LOGW("Couldn't build trap\n");
        return INVALID_SNMP_REQUEST_ID;
    };
    SNMP_LOGD("%lu informs in informList", informList.size());
    //TODO: could be race condition here, buildStatus to return packet?
    if(replaceQueuedRequests){
        SNMP_LOGD("Removing any outstanding informs for this trap\n");
        remove_inform_from_list(informList, [trap](struct InformItem* informItem) -> bool {
            return informItem->trap == trap;
        });
    }

    if(trap->inform){
        struct InformItem* item = (struct InformItem*)calloc(1, sizeof(struct InformItem));
        item->delay_ms = delay_ms;
        item->received = false;
        item->requestID = trap->requestID;
        item->retries = retries;
        item->ip = ip;
        item->lastSent = millis();
        item->trap = trap;
        item->missed = false;

        SNMP_LOGD("Adding Inform request to queue: %lu\n", item->requestID);

        informList.push_back(item);

        trap->sendTo(ip, true);
    } else {
        // normal send
        SNMP_LOGD("Sending normal trap\n");
        trap->sendTo(ip);
    }

    return trap->requestID;
}